

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlAttrPtr xmlNewDocProp(xmlDocPtr doc,xmlChar *name,xmlChar *value)

{
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  _xmlNode *p_Var3;
  xmlRegisterNodeFunc *pp_Var4;
  _xmlNode *p_Var5;
  _xmlNode *p_Var6;
  
  if (name != (xmlChar *)0x0) {
    pxVar1 = (xmlNodePtr)(*xmlMalloc)(0x60);
    if (pxVar1 != (xmlNodePtr)0x0) {
      pxVar1->_private = (void *)0x0;
      *(undefined8 *)&pxVar1->type = 0;
      pxVar1->content = (xmlChar *)0x0;
      pxVar1->properties = (_xmlAttr *)0x0;
      pxVar1->doc = (_xmlDoc *)0x0;
      pxVar1->ns = (xmlNs *)0x0;
      pxVar1->next = (_xmlNode *)0x0;
      pxVar1->prev = (_xmlNode *)0x0;
      pxVar1->last = (_xmlNode *)0x0;
      pxVar1->parent = (_xmlNode *)0x0;
      pxVar1->name = (xmlChar *)0x0;
      pxVar1->children = (_xmlNode *)0x0;
      pxVar1->type = XML_ATTRIBUTE_NODE;
      if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
        pxVar2 = xmlStrdup(name);
      }
      else {
        pxVar2 = xmlDictLookup(doc->dict,name,-1);
      }
      pxVar1->name = pxVar2;
      pxVar1->doc = doc;
      if (value != (xmlChar *)0x0) {
        p_Var3 = xmlStringGetNodeList(doc,value);
        pxVar1->children = p_Var3;
        p_Var6 = (_xmlNode *)0x0;
        while (p_Var5 = p_Var3, p_Var5 != (_xmlNode *)0x0) {
          p_Var5->parent = pxVar1;
          p_Var3 = p_Var5->next;
          if (p_Var3 == (_xmlNode *)0x0) {
            p_Var6 = p_Var5;
          }
        }
        pxVar1->last = p_Var6;
      }
      if (__xmlRegisterCallbacks == 0) {
        return (xmlAttrPtr)pxVar1;
      }
      pp_Var4 = __xmlRegisterNodeDefaultValue();
      if (*pp_Var4 == (xmlRegisterNodeFunc)0x0) {
        return (xmlAttrPtr)pxVar1;
      }
      pp_Var4 = __xmlRegisterNodeDefaultValue();
      (**pp_Var4)(pxVar1);
      return (xmlAttrPtr)pxVar1;
    }
    xmlTreeErrMemory("building attribute");
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

xmlAttrPtr
xmlNewDocProp(xmlDocPtr doc, const xmlChar *name, const xmlChar *value) {
    xmlAttrPtr cur;

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewDocProp : name == NULL\n");
#endif
	return(NULL);
    }

    /*
     * Allocate a new property and fill the fields.
     */
    cur = (xmlAttrPtr) xmlMalloc(sizeof(xmlAttr));
    if (cur == NULL) {
	xmlTreeErrMemory("building attribute");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlAttr));
    cur->type = XML_ATTRIBUTE_NODE;

    if ((doc != NULL) && (doc->dict != NULL))
	cur->name = xmlDictLookup(doc->dict, name, -1);
    else
	cur->name = xmlStrdup(name);
    cur->doc = doc;
    if (value != NULL) {
	xmlNodePtr tmp;

	cur->children = xmlStringGetNodeList(doc, value);
	cur->last = NULL;

	tmp = cur->children;
	while (tmp != NULL) {
	    tmp->parent = (xmlNodePtr) cur;
	    if (tmp->next == NULL)
		cur->last = tmp;
	    tmp = tmp->next;
	}
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);
}